

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StructurePattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructurePattern,std::span<slang::ast::StructurePattern::FieldPattern,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  pointer pFVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  StructurePattern *pSVar5;
  
  pSVar5 = (StructurePattern *)allocate(this,0x30,8);
  pFVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  SVar3 = args_1->startLoc;
  SVar4 = args_1->endLoc;
  (pSVar5->super_Pattern).kind = Structure;
  (pSVar5->super_Pattern).syntax = (SyntaxNode *)0x0;
  (pSVar5->super_Pattern).sourceRange.startLoc = SVar3;
  (pSVar5->super_Pattern).sourceRange.endLoc = SVar4;
  (pSVar5->patterns)._M_ptr = pFVar1;
  (pSVar5->patterns)._M_extent._M_extent_value = sVar2;
  return pSVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }